

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

int Wlc_ObjCheckIsEmpty_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int iVar1;
  Wlc_Obj_t *pObj_00;
  int local_24;
  int iFanin;
  int k;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  iVar1 = Wlc_ObjType(pObj);
  if (iVar1 == 0) {
    p_local._4_4_ = 1;
  }
  else {
    iVar1 = Wlc_ObjIsPi(pObj);
    if (iVar1 == 0) {
      iVar1 = Wlc_ObjIsCi(pObj);
      if (iVar1 == 0) {
        for (local_24 = 0; iVar1 = Wlc_ObjFaninNum(pObj), local_24 < iVar1; local_24 = local_24 + 1)
        {
          iVar1 = Wlc_ObjFaninId(pObj,local_24);
          pObj_00 = Wlc_NtkObj(p,iVar1);
          iVar1 = Wlc_ObjCheckIsEmpty_rec(p,pObj_00);
          if (iVar1 == 0) {
            return 0;
          }
        }
        p_local._4_4_ = 1;
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      iVar1 = Wlc_ObjId(p,pObj);
      iVar1 = Vec_IntEntry(&p->vRefs,iVar1);
      p_local._4_4_ = (uint)(iVar1 == 0);
    }
  }
  return p_local._4_4_;
}

Assistant:

int Wlc_ObjCheckIsEmpty_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    int k, iFanin;
    if ( Wlc_ObjType(pObj) == 0 )
        return 1;
    if ( Wlc_ObjIsPi(pObj) )
        return Vec_IntEntry(&p->vRefs, Wlc_ObjId(p, pObj)) == 0;
    else if ( Wlc_ObjIsCi(pObj) )
        return 0;
    Wlc_ObjForEachFanin( pObj, iFanin, k )
        if ( !Wlc_ObjCheckIsEmpty_rec(p, Wlc_NtkObj(p, iFanin)) )
            return 0;
    return 1;
}